

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ProcessDescriptor>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::ProcessDescriptor> *this,
          CopyablePtr<perfetto::protos::gen::ProcessDescriptor> *other)

{
  ProcessDescriptor *this_00;
  CopyablePtr<perfetto::protos::gen::ProcessDescriptor> *other_local;
  CopyablePtr<perfetto::protos::gen::ProcessDescriptor> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ProcessDescriptor,_std::default_delete<perfetto::protos::gen::ProcessDescriptor>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (ProcessDescriptor *)operator_new(0xa0);
  perfetto::protos::gen::ProcessDescriptor::ProcessDescriptor(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ProcessDescriptor,_std::default_delete<perfetto::protos::gen::ProcessDescriptor>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }